

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall Network::~Network(Network *this)

{
  vector<Population_*,_std::allocator<Population_*>_> *unaff_retaddr;
  
  std::vector<Population_*,_std::allocator<Population_*>_>::~vector(unaff_retaddr);
  std::vector<Synapse_*,_std::allocator<Synapse_*>_>::~vector
            ((vector<Synapse_*,_std::allocator<Synapse_*>_> *)unaff_retaddr);
  return;
}

Assistant:

Network::~Network()
{
    
}